

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_n_binary_ops_template_signed.h
# Opt level: O0

void __thiscall
test_uintwide_t_n_binary_ops_template_signed<512U,_unsigned_int,_void>::initialize
          (test_uintwide_t_n_binary_ops_template_signed<512U,_unsigned_int,_void> *this)

{
  size_t sVar1;
  uintwide_t<24U,_unsigned_char,_void,_false> *puVar2;
  number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>
  *pnVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  iterator iVar6;
  const_iterator cVar7;
  const_iterator cVar8;
  iterator iVar9;
  test_uintwide_t_n_binary_ops_template_signed<512U,_unsigned_int,_void> *this_local;
  
  std::
  vector<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>_>_>
  ::clear(&this->a_local);
  std::
  vector<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>_>_>
  ::clear(&this->b_local);
  std::
  vector<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>_>_>
  ::clear(&this->a_local_signed);
  std::
  vector<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>_>_>
  ::clear(&this->b_local_signed);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::clear(&this->a_boost);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::clear(&this->b_boost);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::clear(&this->a_boost_signed);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::clear(&this->b_boost_signed);
  sVar1 = test_uintwide_t_n_base::size((test_uintwide_t_n_base *)this);
  std::
  vector<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>_>_>
  ::resize(&this->a_local,sVar1);
  sVar1 = test_uintwide_t_n_base::size((test_uintwide_t_n_base *)this);
  std::
  vector<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>_>_>
  ::resize(&this->b_local,sVar1);
  sVar1 = test_uintwide_t_n_base::size((test_uintwide_t_n_base *)this);
  std::
  vector<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>_>_>
  ::resize(&this->a_local_signed,sVar1);
  sVar1 = test_uintwide_t_n_base::size((test_uintwide_t_n_base *)this);
  std::
  vector<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>_>_>
  ::resize(&this->b_local_signed,sVar1);
  sVar1 = test_uintwide_t_n_base::size((test_uintwide_t_n_base *)this);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::resize(&this->a_boost,sVar1);
  sVar1 = test_uintwide_t_n_base::size((test_uintwide_t_n_base *)this);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::resize(&this->b_boost,sVar1);
  sVar1 = test_uintwide_t_n_base::size((test_uintwide_t_n_base *)this);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::resize(&this->a_boost_signed,sVar1);
  sVar1 = test_uintwide_t_n_base::size((test_uintwide_t_n_base *)this);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::resize(&this->b_boost_signed,sVar1);
  puVar2 = std::
           vector<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>_>_>
           ::data(&this->a_local);
  pnVar3 = std::
           vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
           ::data(&this->a_boost);
  sVar1 = test_uintwide_t_n_base::size((test_uintwide_t_n_base *)this);
  test_uintwide_t_n_base::
  get_equal_random_test_values_boost_and_local_n<math::wide_integer::uintwide_t<512u,unsigned_int,void,false>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512u,512u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>,void>
            (puVar2,pnVar3,sVar1);
  puVar2 = std::
           vector<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>_>_>
           ::data(&this->b_local);
  pnVar3 = std::
           vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
           ::data(&this->b_boost);
  sVar1 = test_uintwide_t_n_base::size((test_uintwide_t_n_base *)this);
  test_uintwide_t_n_base::
  get_equal_random_test_values_boost_and_local_n<math::wide_integer::uintwide_t<512u,unsigned_int,void,false>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512u,512u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>,void>
            (puVar2,pnVar3,sVar1);
  cVar4 = std::
          vector<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>_>_>
          ::cbegin(&this->a_local);
  cVar5 = std::
          vector<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>_>_>
          ::cend(&this->a_local);
  iVar6 = std::
          vector<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>_>_>
          ::begin(&this->a_local_signed);
  std::
  copy<__gnu_cxx::__normal_iterator<math::wide_integer::uintwide_t<512u,unsigned_int,void,false>const*,std::vector<math::wide_integer::uintwide_t<512u,unsigned_int,void,false>,std::allocator<math::wide_integer::uintwide_t<512u,unsigned_int,void,false>>>>,__gnu_cxx::__normal_iterator<math::wide_integer::uintwide_t<512u,unsigned_int,void,true>*,std::vector<math::wide_integer::uintwide_t<512u,unsigned_int,void,true>,std::allocator<math::wide_integer::uintwide_t<512u,unsigned_int,void,true>>>>>
            ((__normal_iterator<const_math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>_*,_std::vector<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>_>_>_>
              )cVar4._M_current,
             (__normal_iterator<const_math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>_*,_std::vector<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>_>_>_>
              )cVar5._M_current,
             (__normal_iterator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>_*,_std::vector<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>_>_>_>
              )iVar6._M_current);
  cVar4 = std::
          vector<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>_>_>
          ::cbegin(&this->b_local);
  cVar5 = std::
          vector<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>_>_>
          ::cend(&this->b_local);
  iVar6 = std::
          vector<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>_>_>
          ::begin(&this->b_local_signed);
  std::
  copy<__gnu_cxx::__normal_iterator<math::wide_integer::uintwide_t<512u,unsigned_int,void,false>const*,std::vector<math::wide_integer::uintwide_t<512u,unsigned_int,void,false>,std::allocator<math::wide_integer::uintwide_t<512u,unsigned_int,void,false>>>>,__gnu_cxx::__normal_iterator<math::wide_integer::uintwide_t<512u,unsigned_int,void,true>*,std::vector<math::wide_integer::uintwide_t<512u,unsigned_int,void,true>,std::allocator<math::wide_integer::uintwide_t<512u,unsigned_int,void,true>>>>>
            ((__normal_iterator<const_math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>_*,_std::vector<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>_>_>_>
              )cVar4._M_current,
             (__normal_iterator<const_math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>_*,_std::vector<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>_>_>_>
              )cVar5._M_current,
             (__normal_iterator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>_*,_std::vector<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>_>_>_>
              )iVar6._M_current);
  cVar7 = std::
          vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
          ::cbegin(&this->a_boost);
  cVar8 = std::
          vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
          ::cend(&this->a_boost);
  iVar9 = std::
          vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
          ::begin(&this->a_boost_signed);
  std::
  copy<__gnu_cxx::__normal_iterator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512u,512u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>const*,std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512u,512u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512u,512u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>>>>,__gnu_cxx::__normal_iterator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512u,512u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>*,std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512u,512u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512u,512u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>>>>>
            ((__normal_iterator<const_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_*,_std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
              )cVar7._M_current,
             (__normal_iterator<const_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_*,_std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
              )cVar8._M_current,
             (__normal_iterator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_*,_std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
              )iVar9._M_current);
  cVar7 = std::
          vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
          ::cbegin(&this->b_boost);
  cVar8 = std::
          vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
          ::cend(&this->b_boost);
  iVar9 = std::
          vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
          ::begin(&this->b_boost_signed);
  std::
  copy<__gnu_cxx::__normal_iterator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512u,512u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>const*,std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512u,512u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512u,512u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>>>>,__gnu_cxx::__normal_iterator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512u,512u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>*,std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512u,512u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512u,512u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>>>>>
            ((__normal_iterator<const_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_*,_std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
              )cVar7._M_current,
             (__normal_iterator<const_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_*,_std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
              )cVar8._M_current,
             (__normal_iterator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_*,_std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
              )iVar9._M_current);
  return;
}

Assistant:

auto initialize() -> void override
    {
      a_local.clear();
      b_local.clear();
      a_local_signed.clear();
      b_local_signed.clear();

      a_boost.clear();
      b_boost.clear();
      a_boost_signed.clear();
      b_boost_signed.clear();

      a_local.resize(size());
      b_local.resize(size());
      a_local_signed.resize(size());
      b_local_signed.resize(size());

      a_boost.resize(size());
      b_boost.resize(size());
      a_boost_signed.resize(size());
      b_boost_signed.resize(size());

      get_equal_random_test_values_boost_and_local_n<local_uint_type, boost_uint_type, AllocatorType>(a_local.data(), a_boost.data(), size());
      get_equal_random_test_values_boost_and_local_n<local_uint_type, boost_uint_type, AllocatorType>(b_local.data(), b_boost.data(), size());

      std::copy(a_local.cbegin(), a_local.cend(), a_local_signed.begin());
      std::copy(b_local.cbegin(), b_local.cend(), b_local_signed.begin());

      std::copy(a_boost.cbegin(), a_boost.cend(), a_boost_signed.begin());
      std::copy(b_boost.cbegin(), b_boost.cend(), b_boost_signed.begin());
    }